

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.c
# Opt level: O0

sexp load_image_callback_p1(sexp ctx,sexp p,void *user)

{
  sexp psVar1;
  long *in_RDX;
  int *in_RSI;
  load_image_state *state;
  sexp res;
  sexp in_stack_00000028;
  sexp local_20;
  
  local_20 = sexp_adjust_fields(in_stack_00000028,(sexp_conflict *)ctx,(_func_sexp_void_ptr_sexp *)p
                                ,user);
  if (local_20 == (sexp)&DAT_0000013e) {
    if ((((ulong)in_RSI & 3) == 0) && (*in_RSI == 0x24)) {
      *(long *)(in_RSI + 0x1824) = *in_RDX + *(long *)(in_RSI + 0x1824);
      *(long *)(in_RSI + 0x182c) = *in_RDX + *(long *)(in_RSI + 0x182c);
      *(undefined8 *)(*(long *)(in_RSI + 2) + 0x10) = 0;
      in_RSI[0x1820] = 0;
      in_RSI[0x1821] = 0;
      *(long *)(in_RSI + 0x1c) = in_RDX[1];
    }
    else if ((((ulong)in_RSI & 3) == 0) && (*in_RSI == 0x18)) {
      psVar1 = sexp_adjust_bytecode(ctx,(_func_sexp_void_ptr_sexp *)p,user);
      if (psVar1 != (sexp)&DAT_0000013e) {
        return psVar1;
      }
    }
    else if ((((((ulong)in_RSI & 3) == 0) && (*in_RSI == 0x10)) ||
             ((((ulong)in_RSI & 3) == 0 && (*in_RSI == 0x11)))) && (*(long *)(in_RSI + 8) != 0)) {
      in_RSI[8] = 0;
      in_RSI[9] = 0;
      *(undefined1 *)(in_RSI + 0xc) = 0;
      *(byte *)((long)in_RSI + 5) = *(byte *)((long)in_RSI + 5) & 0xfd;
    }
    else if ((((ulong)in_RSI & 3) == 0) && (*in_RSI == 0x1a)) {
      in_RSI[4] = 0;
      in_RSI[5] = 0;
    }
    local_20 = (sexp)&DAT_0000013e;
  }
  return local_20;
}

Assistant:

static sexp load_image_callback_p1 (sexp ctx, sexp p, void *user) {
  sexp res = NULL;
  struct load_image_state* state = user;

  if ((res = sexp_adjust_fields(p, state->types, load_image_src_to_dst, state)) != SEXP_TRUE) {
    goto done; }
    
  if (sexp_contextp(p)) {
#if SEXP_USE_GREEN_THREADS
    sexp_context_ip(p) += state->offset;
#endif
    sexp_context_last_fp(p) += state->offset;
    sexp_stack_top(sexp_context_stack(p)) = 0;
    sexp_context_saves(p) = NULL;
    sexp_context_heap(p) = state->heap;
  
  } else if (sexp_bytecodep(p)) {
    if ((res = sexp_adjust_bytecode(p, load_image_src_to_dst, state)) != SEXP_TRUE) {
      goto done; }
    
  } else if (sexp_portp(p) && sexp_port_stream(p)) {
    sexp_port_stream(p) = 0;
    sexp_port_openp(p) = 0;
    sexp_freep(p) = 0;
    
  } else if (sexp_dlp(p)) {
    sexp_dl_handle(p) = NULL;

  }
  res = SEXP_TRUE;
done:
  return res;
}